

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_vmask_sse4.c
# Opt level: O1

void blend_a64_vmask_b12_w4_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,int w,int h)

{
  ulong uVar1;
  undefined8 uVar2;
  long lVar3;
  undefined1 in_XMM0 [16];
  undefined1 auVar4 [16];
  undefined2 uVar5;
  undefined1 auVar6 [12];
  short sVar13;
  undefined2 uVar14;
  undefined2 uVar15;
  undefined2 uVar16;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar12 [16];
  undefined1 auVar17 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  lVar3 = 0;
  auVar4 = pmovsxbw(in_XMM0,0x4040404040404040);
  do {
    auVar7 = pshuflw(ZEXT116(mask[lVar3]),ZEXT116(mask[lVar3]),0);
    auVar8._0_4_ = auVar7._0_4_;
    auVar6._0_8_ = CONCAT44(auVar8._0_4_,auVar8._0_4_);
    auVar6._8_4_ = auVar8._0_4_;
    sVar13 = auVar7._2_2_;
    uVar1 = *(ulong *)src0;
    uVar2 = *(undefined8 *)src1;
    auVar20._8_4_ = 0;
    auVar20._0_8_ = uVar1;
    auVar20._12_2_ = (short)(uVar1 >> 0x30);
    auVar20._14_2_ = (short)((ulong)uVar2 >> 0x30);
    auVar19._12_4_ = auVar20._12_4_;
    auVar19._8_2_ = 0;
    auVar19._0_8_ = uVar1;
    auVar19._10_2_ = (short)((ulong)uVar2 >> 0x20);
    auVar18._10_6_ = auVar19._10_6_;
    auVar18._8_2_ = (short)(uVar1 >> 0x20);
    auVar18._0_8_ = uVar1;
    auVar17._8_8_ = auVar18._8_8_;
    auVar17._6_2_ = (short)((ulong)uVar2 >> 0x10);
    auVar17._4_2_ = (short)(uVar1 >> 0x10);
    auVar17._0_2_ = (undefined2)uVar1;
    auVar17._2_2_ = (short)uVar2;
    auVar11._12_2_ = sVar13;
    auVar11._0_12_ = auVar6;
    auVar11._14_2_ = auVar4._6_2_ - sVar13;
    auVar10._12_4_ = auVar11._12_4_;
    auVar10._0_10_ = auVar6._0_10_;
    auVar10._10_2_ = auVar4._4_2_ - auVar7._0_2_;
    auVar9._10_6_ = auVar10._10_6_;
    auVar9._8_2_ = auVar7._0_2_;
    auVar9._0_8_ = auVar6._0_8_;
    auVar8._8_8_ = auVar9._8_8_;
    auVar8._6_2_ = auVar4._2_2_ - sVar13;
    auVar8._4_2_ = sVar13;
    auVar7._4_12_ = auVar8._4_12_;
    auVar7._2_2_ = auVar4._0_2_ - auVar7._0_2_;
    auVar7 = pmaddwd(auVar7,auVar17);
    auVar12._0_4_ = auVar7._0_4_ >> 5;
    auVar12._4_4_ = auVar7._4_4_ >> 5;
    auVar12._8_4_ = auVar7._8_4_ >> 5;
    auVar12._12_4_ = auVar7._12_4_ >> 5;
    auVar7 = packssdw(auVar12,auVar12);
    uVar5 = pavgw(auVar7._0_2_,0);
    uVar14 = pavgw(auVar7._2_2_,0);
    uVar15 = pavgw(auVar7._4_2_,0);
    uVar16 = pavgw(auVar7._6_2_,0);
    pavgw(auVar7._8_2_,0);
    pavgw(auVar7._10_2_,0);
    pavgw(auVar7._12_2_,0);
    pavgw(auVar7._14_2_,0);
    *(ulong *)dst = CONCAT26(uVar16,CONCAT24(uVar15,CONCAT22(uVar14,uVar5)));
    lVar3 = lVar3 + 1;
    src1 = src1 + src1_stride;
    src0 = (uint16_t *)((long)src0 + (ulong)src0_stride * 2);
    dst = dst + dst_stride;
  } while (h != (int)lVar3);
  return;
}

Assistant:

static void blend_a64_vmask_b12_w4_sse4_1(uint16_t *dst, uint32_t dst_stride,
                                          const uint16_t *src0,
                                          uint32_t src0_stride,
                                          const uint16_t *src1,
                                          uint32_t src1_stride,
                                          const uint8_t *mask, int w, int h) {
  (void)w;
  blend_a64_vmask_bn_w4_sse4_1(dst, dst_stride, src0, src0_stride, src1,
                               src1_stride, mask, h, blend_4_b12);
}